

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O3

int N_VWrmsNormMaskVectorArray(int nvec,N_Vector *X,N_Vector *W,N_Vector id,realtype *nrm)

{
  _func_int_int_N_Vector_ptr_N_Vector_ptr_N_Vector_realtype_ptr *UNRECOVERED_JUMPTABLE;
  int iVar1;
  ulong uVar2;
  realtype rVar3;
  
  UNRECOVERED_JUMPTABLE = id->ops->nvwrmsnormmaskvectorarray;
  if (UNRECOVERED_JUMPTABLE != (_func_int_int_N_Vector_ptr_N_Vector_ptr_N_Vector_realtype_ptr *)0x0)
  {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(nvec,X,W,id,nrm);
    return iVar1;
  }
  if (0 < nvec) {
    uVar2 = 0;
    do {
      rVar3 = (*id->ops->nvwrmsnormmask)(X[uVar2],W[uVar2],id);
      nrm[uVar2] = rVar3;
      uVar2 = uVar2 + 1;
    } while ((uint)nvec != uVar2);
  }
  return 0;
}

Assistant:

int N_VWrmsNormMaskVectorArray(int nvec, N_Vector* X, N_Vector* W, N_Vector id,
                               realtype* nrm)
{
  int i, ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(X[0]));

  if (id->ops->nvwrmsnormmaskvectorarray != NULL) {

    ier = id->ops->nvwrmsnormmaskvectorarray(nvec, X, W, id, nrm);

  } else {

    for (i=0; i<nvec; i++) {
      nrm[i] = id->ops->nvwrmsnormmask(X[i], W[i], id);
    }
    ier = 0;

  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(X[0]));
  return(ier);
}